

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_js_generator.cc
# Opt level: O2

string * __thiscall
t_js_generator::ts_indent_abi_cxx11_(string *__return_storage_ptr__,t_js_generator *this)

{
  char *__rhs;
  string sStack_38;
  
  t_generator::indent_abi_cxx11_(&sStack_38,(t_generator *)this);
  __rhs = "  ";
  if ((this->ts_module_)._M_string_length == 0) {
    __rhs = "";
  }
  std::operator+(__return_storage_ptr__,&sStack_38,__rhs);
  std::__cxx11::string::~string((string *)&sStack_38);
  return __return_storage_ptr__;
}

Assistant:

string ts_indent() { return indent() + (!ts_module_.empty() ? "  " : ""); }